

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O3

void __thiscall GraphLibrary::Graph::add_edge(Graph *this,Node v,Node w)

{
  vector<unsigned_int,std::allocator<unsigned_int>> *pvVar1;
  iterator iVar2;
  pointer pvVar3;
  Node local_20;
  Node local_1c;
  
  pvVar3 = (this->m_adjacency_lists).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (vector<unsigned_int,std::allocator<unsigned_int>> *)(pvVar3 + v);
  iVar2._M_current = *(uint **)(pvVar1 + 8);
  local_20 = w;
  local_1c = v;
  if (iVar2._M_current == *(uint **)(pvVar1 + 0x10)) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              (pvVar1,iVar2,&local_20);
    pvVar3 = (this->m_adjacency_lists).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  else {
    *iVar2._M_current = w;
    *(uint **)(pvVar1 + 8) = iVar2._M_current + 1;
  }
  pvVar1 = (vector<unsigned_int,std::allocator<unsigned_int>> *)(pvVar3 + local_20);
  iVar2._M_current = *(uint **)(pvVar1 + 8);
  if (iVar2._M_current == *(uint **)(pvVar1 + 0x10)) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              (pvVar1,iVar2,&local_1c);
  }
  else {
    *iVar2._M_current = v;
    *(uint **)(pvVar1 + 8) = iVar2._M_current + 1;
  }
  this->m_num_edges = this->m_num_edges + 1;
  return;
}

Assistant:

void Graph::add_edge(const Node v, const Node w) {
        m_adjacency_lists[v].push_back(w);
        m_adjacency_lists[w].push_back(v);

        m_num_edges++;
    }